

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMin
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  pointer pBVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  cpp_dec_float<50U,_int,_void> *v;
  long in_FS_OFFSET;
  bool bVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> local_288;
  int *local_248;
  int local_23c;
  cpp_dec_float<50U,_int,_void> local_238;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  int *local_178;
  cpp_dec_float<50U,_int,_void> *local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
  *local_e8;
  int *local_e0;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_98;
  double local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems._24_5_ = 0;
  local_1b8.data._M_elems[7]._1_3_ = 0;
  local_1b8.data._M_elems._32_5_ = 0;
  local_1b8.data._M_elems[9]._1_3_ = 0;
  local_1b8.exp = 0;
  local_1b8.neg = false;
  local_238.fpclass = cpp_dec_float_finite;
  local_238.prec_elem = 10;
  local_238.data._M_elems[0] = 0;
  local_238.data._M_elems[1] = 0;
  local_238.data._M_elems[2] = 0;
  local_238.data._M_elems[3] = 0;
  local_238.data._M_elems[4] = 0;
  local_238.data._M_elems[5] = 0;
  local_238.data._M_elems._24_5_ = 0;
  local_238.data._M_elems[7]._1_3_ = 0;
  local_238.data._M_elems._32_5_ = 0;
  local_238.data._M_elems[9]._1_3_ = 0;
  local_238.exp = 0;
  local_238.neg = false;
  local_248 = nBp;
  local_178 = minIdx;
  if (*nBp == 0) {
    ::soplex::infinity::__tls_init();
    local_288.fpclass = cpp_dec_float_finite;
    local_288.prec_elem = 10;
    local_288.data._M_elems[0] = 0;
    local_288.data._M_elems[1] = 0;
    local_288.data._M_elems[2] = 0;
    local_288.data._M_elems[3] = 0;
    local_288.data._M_elems[4] = 0;
    local_288.data._M_elems[5] = 0;
    local_288.data._M_elems._24_5_ = 0;
    local_288.data._M_elems[7]._1_3_ = 0;
    local_288.data._M_elems._32_5_ = 0;
    local_288.data._M_elems[9]._1_3_ = 0;
    local_288.exp = 0;
    local_288.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_288,*(double *)(in_FS_OFFSET + -8));
  }
  else {
    iVar11 = *minIdx;
    pBVar3 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = *(undefined8 *)((long)&pBVar3[iVar11].val.m_backend + 0x20);
    local_288.data._M_elems._32_5_ = SUB85(uVar4,0);
    local_288.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_288.data._M_elems._0_8_ = *(undefined8 *)&pBVar3[iVar11].val.m_backend;
    local_288.data._M_elems._8_8_ = *(undefined8 *)((long)&pBVar3[iVar11].val.m_backend + 8);
    puVar2 = (uint *)((long)&pBVar3[iVar11].val.m_backend + 0x10);
    local_288.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    uVar4 = *(undefined8 *)(puVar2 + 2);
    local_288.data._M_elems._24_5_ = SUB85(uVar4,0);
    local_288.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_288.exp = *(int *)((long)&pBVar3[iVar11].val.m_backend + 0x28);
    local_288.neg = *(bool *)((long)&pBVar3[iVar11].val.m_backend + 0x2c);
    local_288._48_8_ = *(undefined8 *)((long)&pBVar3[iVar11].val.m_backend + 0x30);
  }
  local_1b8.data._M_elems._32_5_ = local_288.data._M_elems._32_5_;
  local_1b8.data._M_elems[9]._1_3_ = local_288.data._M_elems[9]._1_3_;
  local_1b8.data._M_elems[4] = local_288.data._M_elems[4];
  local_1b8.data._M_elems[5] = local_288.data._M_elems[5];
  local_1b8.data._M_elems._24_5_ = local_288.data._M_elems._24_5_;
  local_1b8.data._M_elems[7]._1_3_ = local_288.data._M_elems[7]._1_3_;
  local_1b8.data._M_elems[0] = local_288.data._M_elems[0];
  local_1b8.data._M_elems[1] = local_288.data._M_elems[1];
  local_1b8.data._M_elems[2] = local_288.data._M_elems[2];
  local_1b8.data._M_elems[3] = local_288.data._M_elems[3];
  local_1b8.exp = local_288.exp;
  local_1b8.neg = local_288.neg;
  local_1b8.fpclass = local_288.fpclass;
  local_1b8.prec_elem = local_288.prec_elem;
  if (0 < nnz) {
    local_e0 = idx + nnz;
    pnVar1 = &(this->
              super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).epsilon;
    local_58 = *(double *)(in_FS_OFFSET + -8);
    uStack_50 = 0;
    local_48 = SUB84(local_58,0);
    uStack_44 = (uint)((ulong)local_58 >> 0x20) ^ 0x80000000;
    uStack_40 = 0;
    uStack_3c = 0x80000000;
    local_170 = &(this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend;
    local_e8 = &this->breakpoints;
    do {
      iVar11 = *idx;
      local_d8.data._M_elems._32_8_ = *(undefined8 *)(upd[iVar11].m_backend.data._M_elems + 8);
      local_d8.data._M_elems._0_8_ = *(undefined8 *)upd[iVar11].m_backend.data._M_elems;
      local_d8.data._M_elems._8_8_ = *(undefined8 *)(upd[iVar11].m_backend.data._M_elems + 2);
      puVar2 = upd[iVar11].m_backend.data._M_elems + 4;
      local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_d8.exp = upd[iVar11].m_backend.exp;
      local_d8.neg = upd[iVar11].m_backend.neg;
      local_d8.fpclass = upd[iVar11].m_backend.fpclass;
      local_d8.prec_elem = upd[iVar11].m_backend.prec_elem;
      uVar4 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 8);
      local_288.data._M_elems._32_5_ = SUB85(uVar4,0);
      local_288.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_288.data._M_elems._0_16_ = *(undefined1 (*) [16])(pnVar1->m_backend).data._M_elems;
      local_288.data._M_elems._16_8_ =
           *(undefined8 *)
            ((this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.data._M_elems + 4);
      uVar4 = *(undefined8 *)
               ((this->
                super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).epsilon.m_backend.data._M_elems + 6);
      local_288.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_288.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_288.exp =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.exp;
      local_288.neg =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.neg;
      local_288.fpclass =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      local_288.prec_elem =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if ((local_288.fpclass == cpp_dec_float_NaN || local_d8.fpclass == cpp_dec_float_NaN) ||
         (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_d8,&local_288), iVar10 < 1)) {
        uVar4 = *(undefined8 *)
                 ((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.data._M_elems + 8);
        local_288.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_288.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_288.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
        local_288.data._M_elems._8_8_ =
             *(undefined8 *)
              ((this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.data._M_elems + 2);
        local_288.data._M_elems._16_8_ =
             *(undefined8 *)
              ((this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon.m_backend.data._M_elems + 4);
        uVar4 = *(undefined8 *)
                 ((this->
                  super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).epsilon.m_backend.data._M_elems + 6);
        local_288.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_288.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_288.exp =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.exp;
        local_288.neg =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.neg;
        local_288.fpclass =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.fpclass;
        local_288.prec_elem =
             (this->
             super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).epsilon.m_backend.prec_elem;
        if (local_288.data._M_elems[0] != 0 || local_288.fpclass != cpp_dec_float_finite) {
          local_288.neg = (bool)(local_288.neg ^ 1);
        }
        if (((local_288.fpclass != cpp_dec_float_NaN) && (local_d8.fpclass != cpp_dec_float_NaN)) &&
           (local_23c = iVar11,
           iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_d8,&local_288), iVar10 < 0)) {
          ::soplex::infinity::__tls_init();
          pcVar12 = &upp[iVar11].m_backend;
          local_288.fpclass = cpp_dec_float_finite;
          local_288.prec_elem = 10;
          local_288.data._M_elems[0] = 0;
          local_288.data._M_elems[1] = 0;
          local_288.data._M_elems[2] = 0;
          local_288.data._M_elems[3] = 0;
          local_288.data._M_elems[4] = 0;
          local_288.data._M_elems[5] = 0;
          local_288.data._M_elems._24_5_ = 0;
          local_288.data._M_elems[7]._1_3_ = 0;
          local_288.data._M_elems._32_5_ = 0;
          local_288.data._M_elems[9]._1_3_ = 0;
          local_288.exp = 0;
          local_288.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&local_288,local_58);
          if (((pcVar12->fpclass != cpp_dec_float_NaN) && (local_288.fpclass != cpp_dec_float_NaN))
             && (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (pcVar12,&local_288), iVar10 < 0)) {
            local_1f8.fpclass = cpp_dec_float_finite;
            local_1f8.prec_elem = 10;
            local_1f8.data._M_elems[0] = 0;
            local_1f8.data._M_elems[1] = 0;
            local_1f8.data._M_elems[2] = 0;
            local_1f8.data._M_elems[3] = 0;
            local_1f8.data._M_elems[4] = 0;
            local_1f8.data._M_elems[5] = 0;
            local_1f8.data._M_elems._24_5_ = 0;
            local_1f8.data._M_elems[7]._1_3_ = 0;
            local_1f8.data._M_elems._32_5_ = 0;
            local_1f8.data._M_elems[9]._1_3_ = 0;
            local_1f8.exp = 0;
            local_1f8.neg = false;
            if (&local_1f8 == &vec[iVar11].m_backend) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,pcVar12);
              if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
                local_1f8.neg = (bool)(local_1f8.neg ^ 1);
              }
            }
            else {
              if (&local_1f8 != pcVar12) {
                uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
                local_1f8.data._M_elems._32_5_ = SUB85(uVar4,0);
                local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
                local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
                local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
                uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
                local_1f8.data._M_elems._24_5_ = SUB85(uVar4,0);
                local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
                local_1f8.exp = pcVar12->exp;
                local_1f8.neg = pcVar12->neg;
                local_1f8.fpclass = pcVar12->fpclass;
                local_1f8.prec_elem = pcVar12->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_1f8,&vec[iVar11].m_backend);
            }
            pcVar12 = local_170;
            if (local_1f8.fpclass == cpp_dec_float_NaN) {
LAB_002bfebe:
              local_128.fpclass = cpp_dec_float_finite;
              local_128.prec_elem = 10;
              local_128.data._M_elems[0] = 0;
              local_128.data._M_elems[1] = 0;
              local_128.data._M_elems[2] = 0;
              local_128.data._M_elems[3] = 0;
              local_128.data._M_elems[4] = 0;
              local_128.data._M_elems[5] = 0;
              local_128.data._M_elems._24_5_ = 0;
              local_128.data._M_elems[7]._1_3_ = 0;
              local_128.data._M_elems._32_5_ = 0;
              local_128.data._M_elems[9]._1_3_ = 0;
              local_128.exp = 0;
              local_128.neg = false;
              v = &local_1f8;
              if (&local_128 != pcVar12) {
                local_128.data._M_elems._32_5_ = local_1f8.data._M_elems._32_5_;
                local_128.data._M_elems[9]._1_3_ = local_1f8.data._M_elems[9]._1_3_;
                local_128.data._M_elems[4] = local_1f8.data._M_elems[4];
                local_128.data._M_elems[5] = local_1f8.data._M_elems[5];
                local_128.data._M_elems._24_5_ = local_1f8.data._M_elems._24_5_;
                local_128.data._M_elems[7]._1_3_ = local_1f8.data._M_elems[7]._1_3_;
                local_128.data._M_elems[0] = local_1f8.data._M_elems[0];
                local_128.data._M_elems[1] = local_1f8.data._M_elems[1];
                local_128.data._M_elems[2] = local_1f8.data._M_elems[2];
                local_128.data._M_elems[3] = local_1f8.data._M_elems[3];
                local_128.exp = local_1f8.exp;
                local_128.neg = local_1f8.neg;
                local_128.fpclass = local_1f8.fpclass;
                local_128.prec_elem = local_1f8.prec_elem;
                v = pcVar12;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_128,v);
              uVar5._0_4_ = local_128.data._M_elems[0];
              uVar5._4_4_ = local_128.data._M_elems[1];
              uVar7._0_4_ = local_128.data._M_elems[2];
              uVar7._4_4_ = local_128.data._M_elems[3];
              uVar8._0_4_ = local_128.data._M_elems[4];
              uVar8._4_4_ = local_128.data._M_elems[5];
              local_98.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
              local_98.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
              local_98.data._M_elems[0] = local_128.data._M_elems[0];
              local_98.data._M_elems[1] = local_128.data._M_elems[1];
              uVar6 = local_98.data._M_elems._0_8_;
              local_98.data._M_elems[2] = local_128.data._M_elems[2];
              local_98.data._M_elems[3] = local_128.data._M_elems[3];
              local_98.data._M_elems[4] = local_128.data._M_elems[4];
              local_98.data._M_elems[5] = local_128.data._M_elems[5];
              local_98.data._M_elems[9]._1_3_ = local_128.data._M_elems[9]._1_3_;
              local_98.data._M_elems._32_5_ = local_128.data._M_elems._32_5_;
              local_98.exp = local_128.exp;
              local_98.neg = local_128.neg;
              uVar4._0_4_ = local_128.fpclass;
              uVar4._4_4_ = local_128.prec_elem;
              local_98.fpclass = local_128.fpclass;
              local_98.prec_elem = local_128.prec_elem;
              local_98.data._M_elems[0] = local_128.data._M_elems[0];
              bVar13 = local_98.data._M_elems[0] == 0;
              pcVar12 = &local_98;
              bVar9 = local_128.neg;
              local_98.data._M_elems._0_8_ = uVar5;
              if (local_128.fpclass == cpp_dec_float_finite && bVar13) goto LAB_002bfcc0;
            }
            else {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&local_288,0,(type *)0x0);
              iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_1f8,&local_288);
              if (0 < iVar11) goto LAB_002bfebe;
              uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
              local_168.data._M_elems._32_5_ = SUB85(uVar4,0);
              local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_168.data._M_elems._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
              local_168.data._M_elems._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
              local_168.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
              uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
              local_168.data._M_elems._24_5_ = SUB85(uVar4,0);
              local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
              local_168.exp =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.exp;
              bVar9 = (this->
                      super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).fastDelta.m_backend.neg;
              local_168.fpclass =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.fpclass;
              local_168.prec_elem =
                   (this->
                   super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).fastDelta.m_backend.prec_elem;
              pcVar12 = &local_168;
              local_168.neg = (bool)bVar9;
              uVar6 = local_98.data._M_elems._0_8_;
              uVar7 = local_98.data._M_elems._8_8_;
              uVar8 = local_98.data._M_elems._16_8_;
              uVar4 = local_98._48_8_;
              if (local_168.fpclass == cpp_dec_float_finite && local_168.data._M_elems[0] == 0)
              goto LAB_002bfcc0;
            }
            local_98.data._M_elems._0_8_ = uVar6;
            pcVar12->neg = (bool)(bVar9 ^ 1);
            uVar7 = local_98.data._M_elems._8_8_;
            uVar8 = local_98.data._M_elems._16_8_;
            uVar4 = local_98._48_8_;
            goto LAB_002bfcc0;
          }
        }
      }
      else {
        local_23c = iVar11;
        ::soplex::infinity::__tls_init();
        pcVar12 = &low[iVar11].m_backend;
        local_288.fpclass = cpp_dec_float_finite;
        local_288.prec_elem = 10;
        local_288.data._M_elems[0] = 0;
        local_288.data._M_elems[1] = 0;
        local_288.data._M_elems[2] = 0;
        local_288.data._M_elems[3] = 0;
        local_288.data._M_elems[4] = 0;
        local_288.data._M_elems[5] = 0;
        local_288.data._M_elems._24_5_ = 0;
        local_288.data._M_elems[7]._1_3_ = 0;
        local_288.data._M_elems._32_5_ = 0;
        local_288.data._M_elems[9]._1_3_ = 0;
        local_288.exp = 0;
        local_288.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_288,(double)CONCAT44(uStack_44,local_48));
        if (((pcVar12->fpclass == cpp_dec_float_NaN) || (local_288.fpclass == cpp_dec_float_NaN)) ||
           (iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (pcVar12,&local_288), iVar10 < 1)) goto LAB_002bfe20;
        local_1f8.fpclass = cpp_dec_float_finite;
        local_1f8.prec_elem = 10;
        local_1f8.data._M_elems[0] = 0;
        local_1f8.data._M_elems[1] = 0;
        local_1f8.data._M_elems[2] = 0;
        local_1f8.data._M_elems[3] = 0;
        local_1f8.data._M_elems[4] = 0;
        local_1f8.data._M_elems[5] = 0;
        local_1f8.data._M_elems._24_5_ = 0;
        local_1f8.data._M_elems[7]._1_3_ = 0;
        local_1f8.data._M_elems._32_5_ = 0;
        local_1f8.data._M_elems[9]._1_3_ = 0;
        local_1f8.exp = 0;
        local_1f8.neg = false;
        if (&local_1f8 == &vec[iVar11].m_backend) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1f8,pcVar12);
          if (local_1f8.data._M_elems[0] != 0 || local_1f8.fpclass != cpp_dec_float_finite) {
            local_1f8.neg = (bool)(local_1f8.neg ^ 1);
          }
        }
        else {
          if (&local_1f8 != pcVar12) {
            uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
            local_1f8.data._M_elems._32_5_ = SUB85(uVar4,0);
            local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
            local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
            local_1f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
            uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
            local_1f8.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_1f8.exp = pcVar12->exp;
            local_1f8.neg = pcVar12->neg;
            local_1f8.fpclass = pcVar12->fpclass;
            local_1f8.prec_elem = pcVar12->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_1f8,&vec[iVar11].m_backend);
        }
        pcVar12 = local_170;
        if (local_1f8.fpclass != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_288,0,(type *)0x0);
          iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_1f8,&local_288);
          uVar7 = local_98.data._M_elems._8_8_;
          uVar8 = local_98.data._M_elems._16_8_;
          uVar4 = local_98._48_8_;
          if (-1 < iVar11) goto LAB_002bfcc0;
        }
        local_168.fpclass = cpp_dec_float_finite;
        local_168.prec_elem = 10;
        local_168.data._M_elems[0] = 0;
        local_168.data._M_elems[1] = 0;
        local_168.data._M_elems[2] = 0;
        local_168.data._M_elems[3] = 0;
        local_168.data._M_elems[4] = 0;
        local_168.data._M_elems[5] = 0;
        local_168.data._M_elems._24_5_ = 0;
        local_168.data._M_elems[7]._1_3_ = 0;
        local_168.data._M_elems._32_5_ = 0;
        local_168.data._M_elems[9]._1_3_ = 0;
        local_168.exp = 0;
        local_168.neg = false;
        if (&local_168 != pcVar12) {
          uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_168.data._M_elems._32_5_ = SUB85(uVar4,0);
          local_168.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_168.data._M_elems._0_8_ = *(undefined8 *)(pcVar12->data)._M_elems;
          local_168.data._M_elems._8_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 2);
          local_168.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          uVar4 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          local_168.data._M_elems._24_5_ = SUB85(uVar4,0);
          local_168.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_168.exp =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).fastDelta.m_backend.exp;
          local_168.neg =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).fastDelta.m_backend.neg;
          local_168.fpclass =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).fastDelta.m_backend.fpclass;
          local_168.prec_elem =
               (this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).fastDelta.m_backend.prec_elem;
        }
        pcVar12 = &local_168;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (pcVar12,&local_1f8);
        uVar7 = local_98.data._M_elems._8_8_;
        uVar8 = local_98.data._M_elems._16_8_;
        uVar4 = local_98._48_8_;
LAB_002bfcc0:
        local_98._48_8_ = uVar4;
        local_98.data._M_elems._16_8_ = uVar8;
        local_98.data._M_elems._8_8_ = uVar7;
        local_288.fpclass = cpp_dec_float_finite;
        local_288.prec_elem = 10;
        local_288.data._M_elems[0] = 0;
        local_288.data._M_elems[1] = 0;
        local_288.data._M_elems[2] = 0;
        local_288.data._M_elems[3] = 0;
        local_288.data._M_elems[4] = 0;
        local_288.data._M_elems[5] = 0;
        local_288.data._M_elems._24_5_ = 0;
        local_288.data._M_elems[7]._1_3_ = 0;
        local_288.data._M_elems._32_5_ = 0;
        local_288.data._M_elems[9]._1_3_ = 0;
        local_288.exp = 0;
        local_288.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_288,pcVar12,&local_d8);
        local_238.data._M_elems._32_5_ = local_288.data._M_elems._32_5_;
        local_238.data._M_elems[9]._1_3_ = local_288.data._M_elems[9]._1_3_;
        local_238.data._M_elems[4] = local_288.data._M_elems[4];
        local_238.data._M_elems[5] = local_288.data._M_elems[5];
        local_238.data._M_elems._24_5_ = local_288.data._M_elems._24_5_;
        local_238.data._M_elems[7]._1_3_ = local_288.data._M_elems[7]._1_3_;
        local_238.data._M_elems[0] = local_288.data._M_elems[0];
        local_238.data._M_elems[1] = local_288.data._M_elems[1];
        local_238.data._M_elems[2] = local_288.data._M_elems[2];
        local_238.data._M_elems[3] = local_288.data._M_elems[3];
        local_238.exp = local_288.exp;
        local_238.neg = local_288.neg;
        local_238.fpclass = local_288.fpclass;
        local_238.prec_elem = local_288.prec_elem;
        uVar4 = local_238._48_8_;
        pBVar3 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar3[*local_248].idx = local_23c;
        iVar11 = *local_248;
        pBVar3[iVar11].src = src;
        *(undefined8 *)&pBVar3[iVar11].val.m_backend = local_288.data._M_elems._0_8_;
        *(undefined8 *)((long)&pBVar3[iVar11].val.m_backend + 8) = local_288.data._M_elems._8_8_;
        puVar2 = (uint *)((long)&pBVar3[iVar11].val.m_backend + 0x10);
        *(undefined8 *)puVar2 = local_288.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
        *(ulong *)((long)&pBVar3[iVar11].val.m_backend + 0x20) =
             CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
        *(int *)((long)&pBVar3[iVar11].val.m_backend + 0x28) = local_288.exp;
        *(bool *)((long)&pBVar3[iVar11].val.m_backend + 0x2c) = local_288.neg;
        *(undefined8 *)((long)&pBVar3[iVar11].val.m_backend + 0x30) = local_288._48_8_;
        local_238.fpclass = local_288.fpclass;
        bVar13 = local_238.fpclass != cpp_dec_float_NaN;
        local_238._48_8_ = uVar4;
        if (((bVar13) && (local_1b8.fpclass != cpp_dec_float_NaN)) &&
           (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_238,&local_1b8), iVar11 < 0)) {
          local_1b8.data._M_elems._32_5_ = local_238.data._M_elems._32_5_;
          local_1b8.data._M_elems[9]._1_3_ = local_238.data._M_elems[9]._1_3_;
          local_1b8.data._M_elems[4] = local_238.data._M_elems[4];
          local_1b8.data._M_elems[5] = local_238.data._M_elems[5];
          local_1b8.data._M_elems._24_5_ = local_238.data._M_elems._24_5_;
          local_1b8.data._M_elems[7]._1_3_ = local_238.data._M_elems[7]._1_3_;
          local_1b8.data._M_elems[0] = local_238.data._M_elems[0];
          local_1b8.data._M_elems[1] = local_238.data._M_elems[1];
          local_1b8.data._M_elems[2] = local_238.data._M_elems[2];
          local_1b8.data._M_elems[3] = local_238.data._M_elems[3];
          local_1b8.exp = local_238.exp;
          local_1b8.neg = local_238.neg;
          local_1b8.fpclass = local_238.fpclass;
          local_1b8.prec_elem = local_238.prec_elem;
          *local_178 = *local_248;
        }
        *local_248 = *local_248 + 1;
      }
LAB_002bfe20:
      if ((int)((ulong)((long)(this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->breakpoints).data.
                             super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6) <= *local_248) {
        std::
        vector<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
        ::resize(&local_e8->data,(long)*local_248 * 2);
      }
      idx = idx + 1;
    } while (idx < local_e0);
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMin(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];

            curVal = (y >= 0) ? this->fastDelta / x : (this->fastDelta - y) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? -this->fastDelta / x : -(y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}